

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

btScalar __thiscall
btGeneric6DofSpring2Constraint::getParam(btGeneric6DofSpring2Constraint *this,int num,int axis)

{
  btScalar *pbVar1;
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  btScalar retVal;
  btScalar local_14;
  
  local_14 = 0.0;
  if ((in_EDX < 0) || (2 < in_EDX)) {
    if ((2 < in_EDX) && (in_EDX < 6)) {
      switch(in_ESI) {
      case 1:
        local_14 = *(btScalar *)(in_RDI + (long)(in_EDX + -3) * 0x58 + 0x3f4);
        break;
      case 2:
        local_14 = *(btScalar *)(in_RDI + (long)(in_EDX + -3) * 0x58 + 0x3ec);
        break;
      case 3:
        local_14 = *(btScalar *)(in_RDI + (long)(in_EDX + -3) * 0x58 + 0x3f8);
        break;
      case 4:
        local_14 = *(btScalar *)(in_RDI + (long)(in_EDX + -3) * 0x58 + 0x3f0);
      }
    }
  }
  else {
    switch(in_ESI) {
    case 1:
      pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x310));
      local_14 = pbVar1[in_EDX];
      break;
    case 2:
      pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x2f0));
      local_14 = pbVar1[in_EDX];
      break;
    case 3:
      pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 800));
      local_14 = pbVar1[in_EDX];
      break;
    case 4:
      pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x300));
      local_14 = pbVar1[in_EDX];
    }
  }
  return local_14;
}

Assistant:

btScalar btGeneric6DofSpring2Constraint::getParam(int num, int axis) const 
{
	btScalar retVal = 0;
	if((axis >= 0) && (axis < 3))
	{
		switch(num)
		{
			case BT_CONSTRAINT_STOP_ERP : 
				btAssertConstrParams(m_flags & (BT_6DOF_FLAGS_ERP_STOP2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2)));
				retVal = m_linearLimits.m_stopERP[axis];
				break;
			case BT_CONSTRAINT_STOP_CFM : 
				btAssertConstrParams(m_flags & (BT_6DOF_FLAGS_CFM_STOP2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2)));
				retVal = m_linearLimits.m_stopCFM[axis];
				break;
			case BT_CONSTRAINT_ERP : 
				btAssertConstrParams(m_flags & (BT_6DOF_FLAGS_ERP_MOTO2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2)));
				retVal = m_linearLimits.m_motorERP[axis];
				break;
			case BT_CONSTRAINT_CFM : 
				btAssertConstrParams(m_flags & (BT_6DOF_FLAGS_CFM_MOTO2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2)));
				retVal = m_linearLimits.m_motorCFM[axis];
				break;
			default : 
				btAssertConstrParams(0);
		}
	}
	else if((axis >=3) && (axis < 6))
	{
		switch(num)
		{
			case BT_CONSTRAINT_STOP_ERP : 
				btAssertConstrParams(m_flags & (BT_6DOF_FLAGS_ERP_STOP2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2)));
				retVal = m_angularLimits[axis - 3].m_stopERP;
				break;
			case BT_CONSTRAINT_STOP_CFM : 
				btAssertConstrParams(m_flags & (BT_6DOF_FLAGS_CFM_STOP2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2)));
				retVal = m_angularLimits[axis - 3].m_stopCFM;
				break;
			case BT_CONSTRAINT_ERP : 
				btAssertConstrParams(m_flags & (BT_6DOF_FLAGS_ERP_MOTO2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2)));
				retVal = m_angularLimits[axis - 3].m_motorERP;
				break;
			case BT_CONSTRAINT_CFM : 
				btAssertConstrParams(m_flags & (BT_6DOF_FLAGS_CFM_MOTO2 << (axis * BT_6DOF_FLAGS_AXIS_SHIFT2)));
				retVal = m_angularLimits[axis - 3].m_motorCFM;
				break;
			default : 
				btAssertConstrParams(0);
		}
	}
	else
	{
		btAssertConstrParams(0);
	}
	return retVal;
}